

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_functions.cpp
# Opt level: O0

ir_function_signature * __thiscall
anon_unknown.dwarf_b1ea9::builtin_builder::_textureCubeArrayShadow
          (builtin_builder *this,ir_texture_opcode opcode,builtin_available_predicate avail,
          glsl_type *sampler_type)

{
  ir_variable *var;
  ir_variable *var_00;
  ir_variable *var_01;
  ir_variable *this_00;
  ir_dereference_variable *piVar1;
  ir_return *ir;
  exec_node *local_b0;
  exec_node *local_98;
  operand local_78;
  ir_variable *local_70;
  ir_variable *lod;
  ir_variable *bias;
  ir_texture *tex;
  ir_factory body;
  ir_function_signature *sig;
  ir_variable *compare;
  ir_variable *P;
  ir_variable *s;
  glsl_type *sampler_type_local;
  builtin_available_predicate avail_local;
  ir_texture_opcode opcode_local;
  builtin_builder *this_local;
  
  var = in_var(this,sampler_type,"sampler");
  var_00 = in_var(this,&glsl_type::_vec4_type,"P");
  var_01 = in_var(this,&glsl_type::_float_type,"compare");
  body.mem_ctx = new_sig(this,&glsl_type::_float_type,avail,3,var,var_00,var_01);
  ir_builder::ir_factory::ir_factory
            ((ir_factory *)&tex,&((ir_function_signature *)body.mem_ctx)->body,this->mem_ctx);
  *(byte *)((long)body.mem_ctx + 0x48) = *(byte *)((long)body.mem_ctx + 0x48) & 0xfe | 1;
  this_00 = (ir_variable *)exec_node::operator_new(0x68,this->mem_ctx);
  ir_texture::ir_texture((ir_texture *)this_00,opcode);
  bias = this_00;
  piVar1 = var_ref(this,var);
  ir_texture::set_sampler
            ((ir_texture *)this_00,&piVar1->super_ir_dereference,&glsl_type::_float_type);
  piVar1 = var_ref(this,var_00);
  *(ir_dereference_variable **)(bias->name_storage + 8) = piVar1;
  piVar1 = var_ref(this,var_01);
  *(ir_dereference_variable **)&(bias->data).image_format = piVar1;
  if (opcode == ir_txb) {
    lod = in_var(this,&glsl_type::_float_type,"bias");
    local_98 = (exec_node *)0x0;
    if (lod != (ir_variable *)0x0) {
      local_98 = &(lod->super_ir_instruction).super_exec_node;
    }
    exec_list::push_tail((exec_list *)((long)body.mem_ctx + 0x28),local_98);
    piVar1 = var_ref(this,lod);
    *(ir_dereference_variable **)&(bias->data).stream = piVar1;
  }
  if (opcode == ir_txl) {
    local_70 = in_var(this,&glsl_type::_float_type,"lod");
    local_b0 = (exec_node *)0x0;
    if (local_70 != (ir_variable *)0x0) {
      local_b0 = &(local_70->super_ir_instruction).super_exec_node;
    }
    exec_list::push_tail((exec_list *)((long)body.mem_ctx + 0x28),local_b0);
    piVar1 = var_ref(this,local_70);
    *(ir_dereference_variable **)&(bias->data).stream = piVar1;
  }
  ir_builder::operand::operand(&local_78,(ir_rvalue *)bias);
  ir = ir_builder::ret(local_78);
  ir_builder::ir_factory::emit((ir_factory *)&tex,(ir_instruction *)ir);
  return (ir_function_signature *)body.mem_ctx;
}

Assistant:

ir_function_signature *
builtin_builder::_textureCubeArrayShadow(ir_texture_opcode opcode,
                                         builtin_available_predicate avail,
                                         const glsl_type *sampler_type)
{
   ir_variable *s = in_var(sampler_type, "sampler");
   ir_variable *P = in_var(glsl_type::vec4_type, "P");
   ir_variable *compare = in_var(glsl_type::float_type, "compare");
   MAKE_SIG(glsl_type::float_type, avail, 3, s, P, compare);

   ir_texture *tex = new(mem_ctx) ir_texture(opcode);
   tex->set_sampler(var_ref(s), glsl_type::float_type);

   tex->coordinate = var_ref(P);
   tex->shadow_comparator = var_ref(compare);

   if (opcode == ir_txb) {
      ir_variable *bias = in_var(glsl_type::float_type, "bias");
      sig->parameters.push_tail(bias);
      tex->lod_info.bias = var_ref(bias);
   }

   if (opcode == ir_txl) {
      ir_variable *lod = in_var(glsl_type::float_type, "lod");
      sig->parameters.push_tail(lod);
      tex->lod_info.lod = var_ref(lod);
   }

   body.emit(ret(tex));

   return sig;
}